

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sext(APInt *this,uint Width)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t *puVar7;
  uint64_t *__src;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt AVar9;
  uint Width_local;
  APInt *this_local;
  APInt *Result;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,Width);
  if (in_EDX <= this_00->BitWidth) {
    __assert_fail("Width > BitWidth && \"Invalid APInt SignExtend request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x349,"APInt llvm::APInt::sext(unsigned int) const");
  }
  if (in_EDX < 0x41) {
    uVar6 = SignExtend64((this_00->U).VAL,this_00->BitWidth);
    APInt(this,in_EDX,uVar6,false);
    uVar8 = extraout_RDX;
  }
  else {
    uVar3 = getNumWords(in_EDX);
    puVar7 = getMemory(uVar3);
    APInt(this,puVar7,in_EDX);
    puVar7 = (this->U).pVal;
    __src = getRawData(this_00);
    uVar3 = getNumWords(this_00);
    memcpy(puVar7,__src,(ulong)(uVar3 << 3));
    puVar7 = (this->U).pVal;
    uVar3 = getNumWords(this_00);
    uVar6 = SignExtend64(puVar7[uVar3 - 1],(this_00->BitWidth - 1 & 0x3f) + 1);
    puVar7 = (this->U).pVal;
    uVar3 = getNumWords(this_00);
    puVar7[uVar3 - 1] = uVar6;
    puVar7 = (this->U).pVal;
    uVar3 = getNumWords(this_00);
    bVar1 = isNegative(this_00);
    bVar2 = 0;
    if (bVar1) {
      bVar2 = 0xff;
    }
    uVar4 = getNumWords(this);
    uVar5 = getNumWords(this_00);
    memset(puVar7 + uVar3,(uint)bVar2,(ulong)((uVar4 - uVar5) * 8));
    clearUnusedBits(this);
    uVar8 = extraout_RDX_00;
  }
  AVar9._8_8_ = uVar8;
  AVar9.U.pVal = (uint64_t *)this;
  return AVar9;
}

Assistant:

APInt APInt::sext(unsigned Width) const {
  assert(Width > BitWidth && "Invalid APInt SignExtend request");

  if (Width <= APINT_BITS_PER_WORD)
    return APInt(Width, SignExtend64(U.VAL, BitWidth));

  APInt Result(getMemory(getNumWords(Width)), Width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Sign extend the last word since there may be unused bits in the input.
  Result.U.pVal[getNumWords() - 1] =
      SignExtend64(Result.U.pVal[getNumWords() - 1],
                   ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

  // Fill with sign bits.
  std::memset(Result.U.pVal + getNumWords(), isNegative() ? -1 : 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);
  Result.clearUnusedBits();
  return Result;
}